

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O0

int uECC_make_key(uint8_t *public_key,uint8_t *private_key)

{
  int iVar1;
  ulong local_90;
  uECC_word_t tries;
  EccPoint public;
  uECC_word_t private [4];
  uint8_t *private_key_local;
  uint8_t *public_key_local;
  
  local_90 = 0;
  while( true ) {
    if (0x3f < local_90) {
      return 0;
    }
    iVar1 = (*g_rng_function)((uint8_t *)(public.y + 3),0x20);
    if ((iVar1 != 0) &&
       (iVar1 = EccPoint_compute_public_key((EccPoint *)&tries,public.y + 3), iVar1 != 0)) break;
    local_90 = local_90 + 1;
  }
  vli_nativeToBytes(private_key,public.y + 3);
  vli_nativeToBytes(public_key,&tries);
  vli_nativeToBytes(public_key + 0x20,public.x + 3);
  return 1;
}

Assistant:

int uECC_make_key(uint8_t public_key[uECC_BYTES*2], uint8_t private_key[uECC_BYTES]) {
    uECC_word_t private[uECC_WORDS];
    EccPoint public;
    uECC_word_t tries;
    for (tries = 0; tries < MAX_TRIES; ++tries) {
        if (g_rng_function((uint8_t *)private, sizeof(private)) &&
                EccPoint_compute_public_key(&public, private)) {
            vli_nativeToBytes(private_key, private);
            vli_nativeToBytes(public_key, public.x);
            vli_nativeToBytes(public_key + uECC_BYTES, public.y);
            return 1;
        }
    }
    return 0;
}